

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::deepSearchPath(Graph *this,Vertex *start,int value)

{
  uint uVar1;
  Vertex *start_00;
  Edge *local_28;
  Edge *e;
  int value_local;
  Vertex *start_local;
  Graph *this_local;
  
  if (start == (Vertex *)0x0) {
    printf("inicio NULL\n");
  }
  else {
    for (local_28 = Vertex::getEdgesList(start); local_28 != (Edge *)0x0;
        local_28 = Edge::getNext(local_28)) {
      Vertex::setIdTree(start,value);
      uVar1 = Vertex::getID(start);
      printf("no: %d\t",(ulong)uVar1);
      start_00 = Edge::getDestiny(local_28);
      deepSearchPath(this,start_00,value);
    }
  }
  return;
}

Assistant:

void Graph::deepSearchPath(Vertex *start, int value) {
    if(start==NULL)
        printf("inicio NULL\n");
    else{
        for(Edge *e = start->getEdgesList(); e != NULL; e = e->getNext()){
            start->setIdTree(value);
            printf("no: %d\t", start->getID());
            this->deepSearchPath(e->getDestiny(), value);
        }
    }
}